

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.c
# Opt level: O1

void sysbvm_backtrace_print(void)

{
  void *__ptr;
  uint uVar1;
  ulong uVar2;
  void *backtraceAddresses [100];
  undefined1 auStack_348 [808];
  
  uVar1 = backtrace(auStack_348,100);
  if ((int)uVar1 < 0) {
    sysbvm_backtrace_print_cold_1();
  }
  else {
    __ptr = (void *)backtrace_symbols(auStack_348,uVar1);
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        puts(*(char **)((long)__ptr + uVar2 * 8));
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    free(__ptr);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_backtrace_print(void)
{    
    void *backtraceAddresses[SYSBVM_BACKTRACE_PRINT_MAX_SIZE];

    int backtraceSize = sysbvm_backtrace_obtain(backtraceAddresses, SYSBVM_BACKTRACE_PRINT_MAX_SIZE);
    if(backtraceSize < 0)
    {
        fprintf(stderr, "Failed to obtain a backtrace.");
        return;
    }

    char **symbols = sysbvm_backtrace_symbols(backtraceAddresses, backtraceSize);
    for(int i = 0; i < backtraceSize; ++i)
        printf("%s\n", symbols[i]);
    free(symbols);
}